

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O3

MPP_RET __thiscall Mpp::enqueue(Mpp *this,MppPortType type,MppTask task)

{
  MppPort port;
  MPP_RET MVar1;
  long lVar2;
  RK_U32 flag;
  
  if (this->mInitDone == 0) {
    return MPP_ERR_INIT;
  }
  flag = 1;
  set_io_mode(this,MPP_IO_MODE_TASK);
  MVar1 = MPP_NOK;
  if (type == MPP_PORT_INPUT) {
    lVar2 = 0x50;
  }
  else {
    if (type != MPP_PORT_OUTPUT) {
      return MPP_NOK;
    }
    flag = 8;
    lVar2 = 0x58;
  }
  port = *(MppPort *)((long)&this->mPktIn + lVar2);
  if ((port != (MppPort)0x0) && (MVar1 = _mpp_port_enqueue("enqueue",port,task), MVar1 == MPP_OK)) {
    notify(this,flag);
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET Mpp::enqueue(MppPortType type, MppTask task)
{
    if (!mInitDone)
        return MPP_ERR_INIT;

    MPP_RET ret = MPP_NOK;
    MppTaskQueue port = NULL;
    RK_U32 notify_flag = 0;

    set_io_mode(MPP_IO_MODE_TASK);

    switch (type) {
    case MPP_PORT_INPUT : {
        port = mUsrInPort;
        notify_flag = MPP_INPUT_ENQUEUE;
    } break;
    case MPP_PORT_OUTPUT : {
        port = mUsrOutPort;
        notify_flag = MPP_OUTPUT_ENQUEUE;
    } break;
    default : {
    } break;
    }

    if (port) {
        ret = mpp_port_enqueue(port, task);
        // if enqueue success wait up thread
        if (MPP_OK == ret)
            notify(notify_flag);
    }

    return ret;
}